

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

void __thiscall btSoftBody::appendFace(btSoftBody *this,int node0,int node1,int node2,Material *mat)

{
  int iVar1;
  Node *pNVar2;
  Face *pFVar3;
  Node *pNVar4;
  Node *pNVar5;
  float fVar6;
  btScalar bVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  if (((node2 != node0) && (node0 != node1)) && (node1 != node2)) {
    appendFace(this,-1,mat);
    iVar1 = (this->m_faces).m_size;
    pNVar2 = (this->m_nodes).m_data;
    pFVar3 = (this->m_faces).m_data;
    pFVar3[(long)iVar1 + -1].m_n[0] = pNVar2 + node0;
    pNVar4 = (this->m_nodes).m_data;
    pFVar3[(long)iVar1 + -1].m_n[1] = pNVar4 + node1;
    pNVar5 = (this->m_nodes).m_data;
    pFVar3[(long)iVar1 + -1].m_n[2] = pNVar5 + node2;
    fVar13 = pNVar2[node0].m_x.m_floats[0];
    fVar6 = pNVar2[node0].m_x.m_floats[1];
    fVar8 = pNVar4[node1].m_x.m_floats[0] - fVar13;
    fVar10 = pNVar4[node1].m_x.m_floats[1] - fVar6;
    fVar12 = pNVar2[node0].m_x.m_floats[2];
    fVar9 = pNVar4[node1].m_x.m_floats[2] - fVar12;
    fVar13 = pNVar5[node2].m_x.m_floats[0] - fVar13;
    fVar6 = pNVar5[node2].m_x.m_floats[1] - fVar6;
    fVar12 = pNVar5[node2].m_x.m_floats[2] - fVar12;
    fVar11 = fVar10 * fVar12 - fVar6 * fVar9;
    fVar12 = fVar9 * fVar13 - fVar12 * fVar8;
    fVar13 = fVar6 * fVar8 - fVar13 * fVar10;
    fVar13 = fVar13 * fVar13 + fVar11 * fVar11 + fVar12 * fVar12;
    if (fVar13 < 0.0) {
      bVar7 = sqrtf(fVar13);
    }
    else {
      bVar7 = SQRT(fVar13);
    }
    pFVar3[(long)iVar1 + -1].m_ra = bVar7;
    this->m_bUpdateRtCst = true;
  }
  return;
}

Assistant:

void			btSoftBody::appendFace(int node0,int node1,int node2,Material* mat)
{
	if (node0==node1)
		return;
	if (node1==node2)
		return;
	if (node2==node0)
		return;

	appendFace(-1,mat);
	Face&	f=m_faces[m_faces.size()-1];
	btAssert(node0!=node1);
	btAssert(node1!=node2);
	btAssert(node2!=node0);
	f.m_n[0]	=	&m_nodes[node0];
	f.m_n[1]	=	&m_nodes[node1];
	f.m_n[2]	=	&m_nodes[node2];
	f.m_ra		=	AreaOf(	f.m_n[0]->m_x,
		f.m_n[1]->m_x,
		f.m_n[2]->m_x);	
	m_bUpdateRtCst=true;
}